

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prob.cpp
# Opt level: O0

char english_letter_sample(int *seed)

{
  char cVar1;
  double cdf_00;
  double cdf;
  char c;
  int *seed_local;
  
  cdf_00 = r8_uniform_01(seed);
  cVar1 = english_letter_cdf_inv(cdf_00);
  return cVar1;
}

Assistant:

char english_letter_sample ( int &seed )

//****************************************************************************80
//
//  Purpose:
//
//    ENGLISH_LETTER_SAMPLE samples the English Letter PDF.
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license.
//
//  Modified:
//
//    06 March 2016
//
//  Author:
//
//    John Burkardt
//
//  Parameters:
//
//    Input/output, int &SEED, a seed for the random number generator.
//
//    Output, character C, a sample of the PDF.
//
{
  char c;
  double cdf;

  cdf = r8_uniform_01 ( seed );

  c = english_letter_cdf_inv ( cdf );

  return c;
}